

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O1

void __thiscall
duckdb::MiniZStreamWrapper::Initialize(MiniZStreamWrapper *this,CompressedFile *file,bool write)

{
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *this_00;
  _Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false> _Var1;
  int iVar2;
  _Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false> _Var3;
  pointer pFVar4;
  InternalException *pIVar5;
  undefined4 extraout_var;
  unsigned_long uVar6;
  type pFVar7;
  undefined4 extraout_var_00;
  long lVar8;
  uint8_t gzip_xlen [2];
  uint8_t gzip_hdr [10];
  string local_60;
  uint8_t local_40 [3];
  uint uStack_3d;
  undefined1 uStack_39;
  undefined1 uStack_38;
  undefined1 uStack_37;
  
  (*(this->super_StreamWrapper)._vptr_StreamWrapper[5])();
  this->file = file;
  _Var3._M_head_impl = (mz_stream_s *)operator_new(0x70);
  (_Var3._M_head_impl)->next_in = (uchar *)0x0;
  *(undefined8 *)&(_Var3._M_head_impl)->avail_in = 0;
  (_Var3._M_head_impl)->total_in = 0;
  (_Var3._M_head_impl)->next_out = (uchar *)0x0;
  *(undefined8 *)&(_Var3._M_head_impl)->avail_out = 0;
  (_Var3._M_head_impl)->total_out = 0;
  (_Var3._M_head_impl)->msg = (char *)0x0;
  (_Var3._M_head_impl)->state = (mz_internal_state *)0x0;
  (_Var3._M_head_impl)->zalloc = (mz_alloc_func)0x0;
  (_Var3._M_head_impl)->zfree = (mz_free_func)0x0;
  (_Var3._M_head_impl)->opaque = (void *)0x0;
  *(undefined8 *)&(_Var3._M_head_impl)->data_type = 0;
  (_Var3._M_head_impl)->adler = 0;
  (_Var3._M_head_impl)->reserved = 0;
  _Var1._M_head_impl =
       (this->mz_stream_ptr).
       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl;
  (this->mz_stream_ptr).
  super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>._M_t.
  super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
  .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var1._M_head_impl != (mz_stream_s *)0x0) {
    operator_delete(_Var1._M_head_impl);
  }
  _Var1._M_head_impl =
       (this->mz_stream_ptr).
       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl;
  (_Var1._M_head_impl)->adler = 0;
  (_Var1._M_head_impl)->reserved = 0;
  (_Var1._M_head_impl)->opaque = (void *)0x0;
  *(undefined8 *)&(_Var1._M_head_impl)->data_type = 0;
  (_Var1._M_head_impl)->zalloc = (mz_alloc_func)0x0;
  (_Var1._M_head_impl)->zfree = (mz_free_func)0x0;
  (_Var1._M_head_impl)->msg = (char *)0x0;
  (_Var1._M_head_impl)->state = (mz_internal_state *)0x0;
  *(undefined8 *)&(_Var1._M_head_impl)->avail_out = 0;
  (_Var1._M_head_impl)->total_out = 0;
  (_Var1._M_head_impl)->total_in = 0;
  (_Var1._M_head_impl)->next_out = (uchar *)0x0;
  (_Var1._M_head_impl)->next_in = (uchar *)0x0;
  *(undefined8 *)&(_Var1._M_head_impl)->avail_in = 0;
  this->writing = write;
  if (write) {
    this->crc = 0;
    this->total_size = 0;
    local_40[0] = '\x1f';
    local_40[1] = 0x8b;
    local_40[2] = 8;
    uStack_39 = 0;
    uStack_38 = 0;
    uStack_3d = 0;
    uStack_37 = 0xff;
    pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(&file->child_handle);
    (*pFVar4->file_system->_vptr_FileSystem[6])(pFVar4->file_system,pFVar4,local_40,10);
    iVar2 = duckdb_miniz::mz_deflateInit2
                      ((this->mz_stream_ptr).
                       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl,6,8,
                       -0xf,1,0);
    if (iVar2 != 0) {
      pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Failed to initialize miniz","");
      InternalException::InternalException(pIVar5,&local_60);
      __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    this_00 = &file->child_handle;
    pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(this_00);
    lVar8 = 10;
    iVar2 = (*pFVar4->file_system->_vptr_FileSystem[5])(pFVar4->file_system,pFVar4,local_40,10);
    uVar6 = NumericCastImpl<unsigned_long,_long,_false>::Convert(CONCAT44(extraout_var,iVar2));
    GZipFileSystem::VerifyGZIPHeader
              (local_40,uVar6,(optional_ptr<duckdb::CompressedFile,_true>)file);
    if ((uStack_3d & 4) != 0) {
      pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(this_00);
      (*pFVar4->file_system->_vptr_FileSystem[0x20])(pFVar4->file_system,pFVar4,10);
      pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(this_00);
      (*pFVar4->file_system->_vptr_FileSystem[5])(pFVar4->file_system,pFVar4,&local_60,2);
      uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert
                        ((uint)(ushort)local_60._M_dataplus._M_p);
      lVar8 = uVar6 + 0xc;
    }
    if ((uStack_3d & 8) != 0) {
      pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(this_00);
      (*pFVar4->file_system->_vptr_FileSystem[0x20])(pFVar4->file_system,pFVar4,lVar8);
      pFVar7 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator*(this_00);
      do {
        iVar2 = (*pFVar7->file_system->_vptr_FileSystem[5])(pFVar7->file_system,pFVar7,&local_60,1);
        lVar8 = lVar8 + 1;
        if (CONCAT44(extraout_var_00,iVar2) != 1) break;
      } while ((char)local_60._M_dataplus._M_p != '\0');
    }
    pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(this_00);
    (*pFVar4->file_system->_vptr_FileSystem[0x20])(pFVar4->file_system,pFVar4,lVar8);
    iVar2 = duckdb_miniz::mz_inflateInit2
                      ((this->mz_stream_ptr).
                       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl,-0xf)
    ;
    if (iVar2 != 0) {
      pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Failed to initialize miniz","");
      InternalException::InternalException(pIVar5,&local_60);
      __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void MiniZStreamWrapper::Initialize(CompressedFile &file, bool write) {
	Close();
	this->file = &file;
	mz_stream_ptr = make_uniq<duckdb_miniz::mz_stream>();
	memset(mz_stream_ptr.get(), 0, sizeof(duckdb_miniz::mz_stream));
	this->writing = write;

	// TODO use custom alloc/free methods in miniz to throw exceptions on OOM
	uint8_t gzip_hdr[GZIP_HEADER_MINSIZE];
	if (write) {
		crc = MZ_CRC32_INIT;
		total_size = 0;

		MiniZStream::InitializeGZIPHeader(gzip_hdr);
		file.child_handle->Write(gzip_hdr, GZIP_HEADER_MINSIZE);

		auto ret = mz_deflateInit2(mz_stream_ptr.get(), duckdb_miniz::MZ_DEFAULT_LEVEL, MZ_DEFLATED,
		                           -MZ_DEFAULT_WINDOW_BITS, 1, 0);
		if (ret != duckdb_miniz::MZ_OK) {
			throw InternalException("Failed to initialize miniz");
		}
	} else {
		idx_t data_start = GZIP_HEADER_MINSIZE;
		auto read_count = file.child_handle->Read(gzip_hdr, GZIP_HEADER_MINSIZE);
		GZipFileSystem::VerifyGZIPHeader(gzip_hdr, NumericCast<idx_t>(read_count), &file);
		// Skip over the extra field if necessary
		if (gzip_hdr[3] & GZIP_FLAG_EXTRA) {
			uint8_t gzip_xlen[2];
			file.child_handle->Seek(data_start);
			file.child_handle->Read(gzip_xlen, 2);
			auto xlen = NumericCast<idx_t>((uint8_t)gzip_xlen[0] | (uint8_t)gzip_xlen[1] << 8);
			data_start += xlen + 2;
		}
		// Skip over the file name if necessary
		if (gzip_hdr[3] & GZIP_FLAG_NAME) {
			file.child_handle->Seek(data_start);
			data_start += GZipConsumeString(*file.child_handle);
		}
		file.child_handle->Seek(data_start);
		// stream is now set to beginning of payload data
		auto ret = duckdb_miniz::mz_inflateInit2(mz_stream_ptr.get(), -MZ_DEFAULT_WINDOW_BITS);
		if (ret != duckdb_miniz::MZ_OK) {
			throw InternalException("Failed to initialize miniz");
		}
	}
}